

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimerQueue.cpp
# Opt level: O2

void __thiscall sznet::TimerQueue::cancel(TimerQueue *this,TimerId timerId)

{
  EventLoop *this_00;
  _Bind<void_(sznet::TimerQueue::*(sznet::TimerQueue_*,_sznet::TimerId))(sznet::TimerId)> local_60;
  Functor local_38;
  
  local_60._M_bound_args.super__Tuple_impl<0UL,_sznet::TimerQueue_*,_sznet::TimerId>.
  super__Tuple_impl<1UL,_sznet::TimerId>.super__Head_base<1UL,_sznet::TimerId,_false>._M_head_impl.
  m_sequence = timerId.m_sequence;
  local_60._M_bound_args.super__Tuple_impl<0UL,_sznet::TimerQueue_*,_sznet::TimerId>.
  super__Tuple_impl<1UL,_sznet::TimerId>.super__Head_base<1UL,_sznet::TimerId,_false>._M_head_impl.
  m_timer = timerId.m_timer;
  this_00 = this->m_loop;
  local_60._M_f = (offset_in_TimerQueue_to_subr)cancelInLoop;
  local_60._8_8_ = 0;
  local_60._M_bound_args.super__Tuple_impl<0UL,_sznet::TimerQueue_*,_sznet::TimerId>.
  super__Head_base<0UL,_sznet::TimerQueue_*,_false>._M_head_impl = this;
  std::function<void()>::
  function<std::_Bind<void(sznet::TimerQueue::*(sznet::TimerQueue*,sznet::TimerId))(sznet::TimerId)>,void>
            ((function<void()> *)&local_38,&local_60);
  net::EventLoop::runInLoop(this_00,&local_38);
  std::_Function_base::~_Function_base(&local_38.super__Function_base);
  return;
}

Assistant:

void TimerQueue::cancel(TimerId timerId)
{
	m_loop->runInLoop(std::bind(&TimerQueue::cancelInLoop, this, timerId));
}